

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.h
# Opt level: O2

void __thiscall lumeview::Shader::add_source(Shader *this,string *filename,GLenum shaderType)

{
  element_type *peVar1;
  GLuint GVar2;
  ostream *poVar3;
  LumeviewError *this_00;
  int success;
  uint shader;
  GLenum shaderType_local;
  char *shaderSrcCStr;
  string local_3f0;
  string shaderSrc;
  stringstream ss;
  ostream local_3a0 [376];
  char infoLog [512];
  
  shaderType_local = shaderType;
  if (((this->m_shaderData).
       super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_shaderProg == 0) {
    GVar2 = (*glad_glCreateProgram)();
    ((this->m_shaderData).
     super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_shaderProg = GVar2;
  }
  LoadStringFromFile(&shaderSrc,filename);
  shaderSrcCStr = shaderSrc._M_dataplus._M_p;
  GVar2 = (*glad_glCreateShader)(shaderType);
  shader = GVar2;
  (*glad_glShaderSource)(GVar2,1,&shaderSrcCStr,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&success);
  if (success != 0) {
    (*glad_glAttachShader)
              (((this->m_shaderData).
                super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_shaderProg,GVar2);
    peVar1 = (this->m_shaderData).
             super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->m_linked = false;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&peVar1->m_shaders,&shader);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&((this->m_shaderData).
                  super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_shaderNames,filename);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&((this->m_shaderData).
                 super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->m_shaderTypes,&shaderType_local);
    std::__cxx11::string::~string((string *)&shaderSrc);
    return;
  }
  (*glad_glGetShaderInfoLog)(GVar2,0x200,(GLsizei *)0x0,infoLog);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_3a0,"SHADER::COMPILATION_FAILED in \'");
  poVar3 = std::operator<<(poVar3,(string *)filename);
  poVar3 = std::operator<<(poVar3,"\'\n");
  std::operator<<(poVar3,infoLog);
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_3f0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

void add_source (std::string filename, GLenum shaderType) {
		if (!data().m_shaderProg)
			data().m_shaderProg = glCreateProgram ();

	//	load the sources from a file
		std::string shaderSrc = LoadStringFromFile (filename);
		const char* shaderSrcCStr = shaderSrc.c_str();

	//	create the shader object and compile the sources
		uint shader;
		shader = glCreateShader (shaderType);
		glShaderSource (shader, 1, &shaderSrcCStr, NULL);
		glCompileShader (shader);

	//	check for errors
		int success;
		glGetShaderiv (shader, GL_COMPILE_STATUS, &success);
		if (!success) {
			char infoLog[512];
			glGetShaderInfoLog (shader, 512, NULL, infoLog);
			THROW("SHADER::COMPILATION_FAILED in '" << filename << "'\n" << infoLog);
		}

		glAttachShader (data().m_shaderProg, shader);
		data().m_linked = false;
		data().m_shaders.push_back (shader);
		data().m_shaderNames.push_back (filename);
		data().m_shaderTypes.push_back (shaderType);
	}